

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

int __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::truncate
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *this,char *__file,
          __off_t __length)

{
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *p;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *local_18;
  
  local_18 = this->_stack + (long)__file;
  while (local_18 != this->_cursor) {
    local_18 = local_18 + 1;
    Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Monom
              ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x73e650);
  }
  this->_cursor = this->_stack + (long)__file;
  return (int)this;
}

Assistant:

inline
  void truncate(size_t len)
  {
    ASS_LE(len,length());
    C* p=_stack+len;
    while(p!=_cursor) {
      (p++)->~C();
    }
    _cursor = _stack+len;
  }